

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O3

void __thiscall QGroupBox::mouseReleaseEvent(QGroupBox *this,QMouseEvent *event)

{
  QGroupBoxPrivate *this_00;
  bool bVar1;
  QRect QVar2;
  int iVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  double dVar5;
  undefined1 auVar6 [16];
  QStyleOptionGroupBox box;
  QRect local_c8;
  QStyleOptionGroupBox local_b8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(event + 0x40) == 1) &&
     (this_00 = *(QGroupBoxPrivate **)&(this->super_QWidget).field_0x8,
     this_00->overCheckBox != false)) {
    memset(&local_b8,0xaa,0x88);
    QStyleOptionGroupBox::QStyleOptionGroupBox(&local_b8);
    (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&local_b8);
    pQVar4 = QWidget::style(&this->super_QWidget);
    auVar6 = QEventPoint::position();
    dVar5 = (double)((ulong)auVar6._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._0_8_;
    bVar1 = 2147483647.0 < dVar5;
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    local_c8.x1.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar5);
    dVar5 = (double)((ulong)auVar6._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._8_8_;
    bVar1 = 2147483647.0 < dVar5;
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    local_c8.y1.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar5);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xd0))(pQVar4,7,&local_b8,&local_c8,this);
    QVar2.x2.m_i = local_c8.x2.m_i;
    QVar2.y2.m_i = local_c8.y2.m_i;
    QVar2.x1.m_i = local_c8.x1.m_i;
    QVar2.y1.m_i = local_c8.y1.m_i;
    this_00->pressedControl = SC_None;
    this_00->overCheckBox = false;
    if (iVar3 - 1U < 2 && this_00->checkable == true) {
      QGroupBoxPrivate::click(this_00);
      QVar2.x2.m_i = local_c8.x2.m_i;
      QVar2.y2.m_i = local_c8.y2.m_i;
      QVar2.x1.m_i = local_c8.x1.m_i;
      QVar2.y1.m_i = local_c8.y1.m_i;
    }
    else if (this_00->checkable != false) {
      pQVar4 = QWidget::style(&this->super_QWidget);
      local_c8 = (QRect)(**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,7,&local_b8,1,this);
      QWidget::update(&this->super_QWidget,&local_c8);
      QVar2 = local_c8;
    }
    local_c8 = QVar2;
    if (&(local_b8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_b8.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
  }
  else {
    event[0xc] = (QMouseEvent)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::mouseReleaseEvent(QMouseEvent *event)
{
    if (event->button() != Qt::LeftButton) {
        event->ignore();
        return;
    }

    Q_D(QGroupBox);
    if (!d->overCheckBox) {
        event->ignore();
        return;
    }
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    QStyle::SubControl released = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                                 event->position().toPoint(), this);
    bool toggle = d->checkable && (released == QStyle::SC_GroupBoxLabel
                                   || released == QStyle::SC_GroupBoxCheckBox);
    d->pressedControl = QStyle::SC_None;
    d->overCheckBox = false;
    if (toggle)
        d->click();
    else if (d->checkable)
        update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));
}